

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

void log_formatted(char *fmt,...)

{
  return;
}

Assistant:

void log_formatted(const char *fmt, ...) {
    if(enable_logging) {
        va_list args;
        va_start(args, fmt);
        vfprintf(stderr, fmt, args);
        va_end(args);
        fprintf(stderr, "\n");
    }
}